

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
RegisterParserTestPhonySelfReferenceKept::RegisterParserTestPhonySelfReferenceKept
          (RegisterParserTestPhonySelfReferenceKept *this)

{
  RegisterParserTestPhonySelfReferenceKept *this_local;
  
  RegisterTest(ParserTestPhonySelfReferenceKept::Create,"ParserTest.PhonySelfReferenceKept");
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceKept) {
  const char kInput[] =
"build a: phony a\n";
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  ManifestParser parser(&state, &fs_, parser_opts);
  string err;
  EXPECT_TRUE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("", err);

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_EQ(edge->inputs_.size(), 1);
  ASSERT_EQ(edge->inputs_[0], node);
}